

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O2

int print_uint32(uint32_t n,char *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = (ulong)n;
  uVar3 = uVar2;
  if (n < 10000) {
    if (n < 100) {
      bVar7 = n < 10;
      iVar1 = 1;
    }
    else {
      bVar7 = n < 1000;
      iVar1 = 3;
    }
LAB_001196ce:
    uVar4 = (iVar1 + 1) - (uint)bVar7;
    uVar6 = (ulong)uVar4;
    pcVar5 = p + uVar6;
    p[uVar6] = '\0';
    if ((uVar4 & 1) == 0) {
      switch(uVar4) {
      default:
        return uVar4;
      case 6:
switchD_00119701_caseD_6:
        pcVar5 = p + (uVar6 - 2);
        *(undefined2 *)pcVar5 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        uVar3 = uVar2 / 100;
      case 4:
        uVar2 = uVar3 / 100;
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar3 % 100) * 2);
        pcVar5 = pcVar5 + -2;
      case 2:
        *(undefined2 *)(pcVar5 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        return uVar4;
      case 8:
        goto switchD_00119701_caseD_8;
      }
    }
    switch(uVar4) {
    case 3:
switchD_0011977d_caseD_3:
      uVar2 = uVar3 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar3 % 100) * 2);
      pcVar5 = pcVar5 + -2;
    case 1:
      pcVar5[-1] = (char)uVar2 + '0';
    default:
      return uVar4;
    case 5:
      goto switchD_0011977d_caseD_5;
    case 7:
      break;
    case 9:
      uVar3 = uVar2 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar2 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      uVar4 = 9;
    }
  }
  else {
    if (9999999 < n) {
      if (999999999 < n) {
        p[10] = '\0';
        *(undefined2 *)(p + 8) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        uVar4 = 10;
        uVar2 = uVar2 / 100;
switchD_00119701_caseD_8:
        *(undefined2 *)(p + 6) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (uVar2 % 100) * 2);
        uVar6 = 6;
        uVar2 = uVar2 / 100;
        goto switchD_00119701_caseD_6;
      }
      bVar7 = n < 100000000;
      iVar1 = 8;
      goto LAB_001196ce;
    }
    if (n < 1000000) {
      bVar7 = n < 100000;
      iVar1 = 5;
      goto LAB_001196ce;
    }
    p[7] = '\0';
    pcVar5 = p + 7;
    uVar4 = 7;
  }
  uVar2 = uVar3 / 100;
  *(undefined2 *)(pcVar5 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (uVar3 % 100) * 2);
  pcVar5 = pcVar5 + -2;
switchD_0011977d_caseD_5:
  uVar3 = uVar2 / 100;
  *(undefined2 *)(pcVar5 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (uVar2 % 100) * 2);
  pcVar5 = pcVar5 + -2;
  goto switchD_0011977d_caseD_3;
}

Assistant:

static int print_uint32(uint32_t n, char *p)
{
    int k = 0;
    const char *dp;

    if(n >= 10000UL) {
        if(n >= 10000000UL) {
            if(n >= 1000000000UL) {
                k = 10;
            } else if(n >= 100000000UL) {
                k = 9;
            } else {
               k = 8;
            }
        } else {
            if(n >= 1000000UL) {
                k = 7;
            } else if(n >= 100000UL) {
                k = 6;
            } else {
                k = 5;
            }
        }
    } else {
        if(n >= 100UL) {
            if(n >= 1000UL) {
                k = 4;
            } else {
                k = 3;
            }
        } else {
            if(n >= 10UL) {
                k = 2;
            } else {
                k = 1UL;
            }
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 9:
            __print_stage();
	    pattribute(fallthrough);
        case 7:
            __print_stage();
	    pattribute(fallthrough);
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 10:
            __print_stage();
	    pattribute(fallthrough);
        case 8:
            __print_stage();
	    pattribute(fallthrough);
        case 6:
            __print_stage();
	    pattribute(fallthrough);
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}